

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void ReleaseMetaLookup(nodecontext *p,nodeclass *Class)

{
  nodeclass *Class_local;
  nodecontext *p_local;
  
  if (Class->ParentClass != (nodeclass *)0x0) {
    if (Class->MetaGet == Class->ParentClass->MetaGet) {
      Class->MetaGet = (nodemetalookuphead *)0x0;
    }
    if (Class->MetaSet == Class->ParentClass->MetaSet) {
      Class->MetaSet = (nodemetalookuphead *)0x0;
    }
    if (Class->MetaUnSet == Class->ParentClass->MetaUnSet) {
      Class->MetaUnSet = (nodemetalookuphead *)0x0;
    }
  }
  if (Class->MetaGet != (nodemetalookuphead *)0x0) {
    (*p->NodeConstHeap->Free)
              (p->NodeConstHeap,Class->MetaGet,(Class->MetaGet->Upper + 1) * 0x10 + 8);
    Class->MetaGet = (nodemetalookuphead *)0x0;
  }
  if (Class->MetaSet != (nodemetalookuphead *)0x0) {
    (*p->NodeConstHeap->Free)
              (p->NodeConstHeap,Class->MetaSet,(Class->MetaSet->Upper + 1) * 0x10 + 8);
    Class->MetaSet = (nodemetalookuphead *)0x0;
  }
  if (Class->MetaUnSet != (nodemetalookuphead *)0x0) {
    (*p->NodeConstHeap->Free)
              (p->NodeConstHeap,Class->MetaUnSet,(Class->MetaUnSet->Upper + 1) * 0x10 + 8);
    Class->MetaUnSet = (nodemetalookuphead *)0x0;
  }
  return;
}

Assistant:

static NOINLINE void ReleaseMetaLookup(nodecontext* p, nodeclass* Class)
{
    if (Class->ParentClass)
    {
        if (Class->MetaGet==Class->ParentClass->MetaGet)
            Class->MetaGet=NULL;
        if (Class->MetaSet==Class->ParentClass->MetaSet)
            Class->MetaSet=NULL;
        if (Class->MetaUnSet==Class->ParentClass->MetaUnSet)
            Class->MetaUnSet=NULL;
    }

    if (Class->MetaGet)
    {
        MemHeap_Free(p->NodeConstHeap,Class->MetaGet,sizeof(nodemetalookuphead)+(Class->MetaGet->Upper+1)*sizeof(nodemetalookup));
        Class->MetaGet = NULL;
    }

    if (Class->MetaSet)
    {
        MemHeap_Free(p->NodeConstHeap,Class->MetaSet,sizeof(nodemetalookuphead)+(Class->MetaSet->Upper+1)*sizeof(nodemetalookup));
        Class->MetaSet = NULL;
    }

    if (Class->MetaUnSet)
    {
        MemHeap_Free(p->NodeConstHeap,Class->MetaUnSet,sizeof(nodemetalookuphead)+(Class->MetaUnSet->Upper+1)*sizeof(nodemetalookup));
        Class->MetaUnSet = NULL;
    }
}